

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

char * dec_ctx_init(dec_ctx *ctx,membuf *inbuf,membuf *outbuf)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  char *pcVar4;
  char *encoding;
  membuf *outbuf_local;
  membuf *inbuf_local;
  dec_ctx *ctx_local;
  
  ctx->bits_read = 0;
  puVar3 = (uchar *)membuf_get(inbuf);
  ctx->inbuf = puVar3;
  iVar1 = membuf_memlen(inbuf);
  ctx->inend = iVar1;
  ctx->inpos = 0;
  ctx->outbuf = outbuf;
  uVar2 = get_byte(ctx);
  ctx->bitbuf = uVar2;
  table_init(ctx,ctx->t);
  pcVar4 = table_dump(ctx->t);
  return pcVar4;
}

Assistant:

char *
dec_ctx_init(struct dec_ctx *ctx, struct membuf *inbuf, struct membuf *outbuf)
{
    char *encoding;
    ctx->bits_read = 0;

    ctx->inbuf = membuf_get(inbuf);
    ctx->inend = membuf_memlen(inbuf);
    ctx->inpos = 0;

    ctx->outbuf = outbuf;

    /* init bitbuf */
    ctx->bitbuf = get_byte(ctx);

    /* init tables */
    table_init(ctx, ctx->t);
    encoding = table_dump(ctx->t);
    return encoding;
}